

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_> *
__thiscall
OpenMD::NameFinder::getAllChildren
          (vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           *__return_storage_ptr__,NameFinder *this,TreeNodePtr *node)

{
  element_type *peVar1;
  _Base_ptr p_Var2;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar1 = (node->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = *(_Base_ptr *)
            ((long)&(peVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  while ((_Rb_tree_header *)p_Var2 != &(peVar1->children)._M_t._M_impl.super__Rb_tree_header) {
    std::
    vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>::
    push_back(__return_storage_ptr__,(value_type *)(p_Var2 + 2));
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    peVar1 = (node->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TreeNodePtr> NameFinder::getAllChildren(TreeNodePtr node) {
    std::vector<TreeNodePtr> childNodes;
    std::map<std::string, TreeNodePtr>::iterator i;
    for (i = node->children.begin(); i != node->children.end(); ++i) {
      childNodes.push_back(i->second);
    }
    return childNodes;
  }